

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predefined_formatters.h
# Opt level: O0

void __thiscall
booster::locale::impl_icu::icu_formatters_cache::icu_formatters_cache
          (icu_formatters_cache *this,Locale *locale)

{
  pointer pDVar1;
  Locale *in_RSI;
  facet *in_RDI;
  SimpleDateFormat *sfmt_2;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> fmt_2;
  int j;
  int i_2;
  SimpleDateFormat *sfmt_1;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> fmt_1;
  int i_1;
  SimpleDateFormat *sfmt;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> fmt;
  int i;
  pointer in_stack_fffffffffffffe38;
  UnicodeString *in_stack_fffffffffffffe40;
  long *local_180;
  long *local_168;
  long *local_110;
  facet *local_d0;
  facet *local_b0;
  facet *local_90;
  facet *local_68;
  int local_50;
  int local_4c;
  int local_34;
  int local_20;
  
  std::locale::facet::facet(in_RDI,0);
  *(undefined ***)in_RDI = &PTR__icu_formatters_cache_002eb210;
  local_68 = in_RDI + 0x10;
  do {
    icu_70::UnicodeString::UnicodeString(in_stack_fffffffffffffe40);
    local_68 = local_68 + 0x40;
  } while (local_68 != in_RDI + 0x110);
  local_90 = in_RDI + 0x110;
  do {
    icu_70::UnicodeString::UnicodeString(in_stack_fffffffffffffe40);
    local_90 = local_90 + 0x40;
  } while (local_90 != in_RDI + 0x210);
  local_b0 = in_RDI + 0x210;
  do {
    icu_70::UnicodeString::UnicodeString(in_stack_fffffffffffffe40);
    local_b0 = local_b0 + 0x40;
  } while (local_b0 != in_RDI + 0x610);
  local_d0 = in_RDI + 0x610;
  do {
    thread_specific_ptr<icu_70::NumberFormat>::thread_specific_ptr
              ((thread_specific_ptr<icu_70::NumberFormat> *)0x272ba6);
    local_d0 = local_d0 + 8;
  } while (local_d0 != in_RDI + 0x648);
  thread_specific_ptr<icu_70::SimpleDateFormat>::thread_specific_ptr
            ((thread_specific_ptr<icu_70::SimpleDateFormat> *)0x272be5);
  icu_70::Locale::Locale((Locale *)(in_RDI + 0x650),in_RSI);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    icu_70::DateFormat::createDateInstance(icu_formatters_cache::styles[local_20],in_RSI);
    std::unique_ptr<icu_70::DateFormat,std::default_delete<icu_70::DateFormat>>::
    unique_ptr<std::default_delete<icu_70::DateFormat>,void>
              ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    pDVar1 = std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::get
                       ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                        in_stack_fffffffffffffe40);
    if (pDVar1 == (pointer)0x0) {
      local_110 = (long *)0x0;
    }
    else {
      local_110 = (long *)__dynamic_cast(pDVar1,&icu_70::DateFormat::typeinfo,
                                         &icu_70::SimpleDateFormat::typeinfo,0);
    }
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 0xf0))(local_110,in_RDI + (long)local_20 * 0x40 + 0x10);
    }
    std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::~unique_ptr
              ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
               in_stack_fffffffffffffe40);
  }
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    icu_70::DateFormat::createTimeInstance(icu_formatters_cache::styles[local_34],in_RSI);
    std::unique_ptr<icu_70::DateFormat,std::default_delete<icu_70::DateFormat>>::
    unique_ptr<std::default_delete<icu_70::DateFormat>,void>
              ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    pDVar1 = std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::get
                       ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                        in_stack_fffffffffffffe40);
    if (pDVar1 == (pointer)0x0) {
      local_168 = (long *)0x0;
    }
    else {
      local_168 = (long *)__dynamic_cast(pDVar1,&icu_70::DateFormat::typeinfo,
                                         &icu_70::SimpleDateFormat::typeinfo,0);
    }
    if (local_168 != (long *)0x0) {
      (**(code **)(*local_168 + 0xf0))(local_168,in_RDI + (long)local_34 * 0x40 + 0x110);
    }
    std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::~unique_ptr
              ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
               in_stack_fffffffffffffe40);
  }
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
      icu_70::DateFormat::createDateTimeInstance
                (icu_formatters_cache::styles[local_4c],icu_formatters_cache::styles[local_50],
                 in_RSI);
      std::unique_ptr<icu_70::DateFormat,std::default_delete<icu_70::DateFormat>>::
      unique_ptr<std::default_delete<icu_70::DateFormat>,void>
                ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                 in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      pDVar1 = std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::get
                         ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>
                           *)in_stack_fffffffffffffe40);
      if (pDVar1 == (pointer)0x0) {
        local_180 = (long *)0x0;
      }
      else {
        local_180 = (long *)__dynamic_cast(pDVar1,&icu_70::DateFormat::typeinfo,
                                           &icu_70::SimpleDateFormat::typeinfo,0);
      }
      if (local_180 != (long *)0x0) {
        (**(code **)(*local_180 + 0xf0))
                  (local_180,in_RDI + (long)local_50 * 0x40 + 0x210 + (long)local_4c * 0x100);
      }
      std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::~unique_ptr
                ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)
                 in_stack_fffffffffffffe40);
    }
  }
  return;
}

Assistant:

icu_formatters_cache(icu::Locale const &locale) :
                locale_(locale)
            {

                static const icu::DateFormat::EStyle styles[4] = { 
                    icu::DateFormat::kShort,
                    icu::DateFormat::kMedium,
                    icu::DateFormat::kLong,
                    icu::DateFormat::kFull
                };


                for(int i=0;i<4;i++) {
                    std::unique_ptr<icu::DateFormat> fmt(icu::DateFormat::createDateInstance(styles[i],locale));
                    icu::SimpleDateFormat *sfmt = dynamic_cast<icu::SimpleDateFormat*>(fmt.get());
                    if(sfmt) {
                        sfmt->toPattern(date_format_[i]);
                    }
                }

                for(int i=0;i<4;i++) {
                    std::unique_ptr<icu::DateFormat> fmt(icu::DateFormat::createTimeInstance(styles[i],locale));
                    icu::SimpleDateFormat *sfmt = dynamic_cast<icu::SimpleDateFormat*>(fmt.get());
                    if(sfmt) {
                        sfmt->toPattern(time_format_[i]);
                    }
                }

                for(int i=0;i<4;i++) {
                    for(int j=0;j<4;j++) {
                        std::unique_ptr<icu::DateFormat> fmt(
                            icu::DateFormat::createDateTimeInstance(styles[i],styles[j],locale));
                        icu::SimpleDateFormat *sfmt = dynamic_cast<icu::SimpleDateFormat*>(fmt.get());
                        if(sfmt) {
                            sfmt->toPattern(date_time_format_[i][j]);
                        }
                    }
                }


            }